

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_decoder.cc
# Opt level: O0

bool __thiscall
draco::MetadataDecoder::DecodeGeometryMetadata
          (MetadataDecoder *this,DecoderBuffer *in_buffer,GeometryMetadata *metadata)

{
  bool bVar1;
  pointer this_00;
  AttributeMetadata *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> att_metadata;
  uint32_t att_unique_id;
  uint32_t i;
  uint32_t num_att_metadata;
  Metadata *in_stack_000000a0;
  MetadataDecoder *in_stack_000000a8;
  pointer in_stack_ffffffffffffff78;
  AttributeMetadata *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 uVar2;
  GeometryMetadata *this_01;
  uint32_t local_2c;
  uint local_28;
  uint local_24;
  AttributeMetadata *local_20;
  byte local_1;
  
  if (in_RDX == (AttributeMetadata *)0x0) {
    local_1 = 0;
  }
  else {
    *in_RDI = in_RSI;
    local_24 = 0;
    local_20 = in_RDX;
    bVar1 = DecodeVarint<unsigned_int>((uint *)in_stack_ffffffffffffff78,(DecoderBuffer *)0x19ad67);
    if (bVar1) {
      for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
        bVar1 = DecodeVarint<unsigned_int>
                          ((uint *)in_stack_ffffffffffffff78,(DecoderBuffer *)0x19ada0);
        if (!bVar1) {
          local_1 = 0;
          goto LAB_0019af0c;
        }
        operator_new(0x68);
        AttributeMetadata::AttributeMetadata(in_stack_ffffffffffffff80);
        this_01 = (GeometryMetadata *)&stack0xffffffffffffffc8;
        std::unique_ptr<draco::AttributeMetadata,std::default_delete<draco::AttributeMetadata>>::
        unique_ptr<std::default_delete<draco::AttributeMetadata>,void>
                  ((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                    *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        this_00 = std::
                  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                  ::operator->((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                                *)0x19adeb);
        AttributeMetadata::set_att_unique_id(this_00,local_2c);
        std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
        get((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> *)
            in_stack_ffffffffffffff80);
        bVar1 = DecodeMetadata(in_stack_000000a8,in_stack_000000a0);
        if (bVar1) {
          in_stack_ffffffffffffff80 = local_20;
          uVar2 = bVar1;
          std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
          ::unique_ptr((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                        *)local_20,
                       (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                        *)in_stack_ffffffffffffff78);
          GeometryMetadata::AddAttributeMetadata
                    (this_01,(unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                              *)CONCAT17(uVar2,in_stack_ffffffffffffff90));
          std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
          ::~unique_ptr((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                         *)in_stack_ffffffffffffff80);
        }
        else {
          local_1 = 0;
        }
        std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
        ~unique_ptr((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                     *)in_stack_ffffffffffffff80);
        if (!bVar1) goto LAB_0019af0c;
      }
      local_1 = DecodeMetadata(in_stack_000000a8,in_stack_000000a0);
    }
    else {
      local_1 = 0;
    }
  }
LAB_0019af0c:
  return (bool)(local_1 & 1);
}

Assistant:

bool MetadataDecoder::DecodeGeometryMetadata(DecoderBuffer *in_buffer,
                                             GeometryMetadata *metadata) {
  if (!metadata) {
    return false;
  }
  buffer_ = in_buffer;
  uint32_t num_att_metadata = 0;
  if (!DecodeVarint(&num_att_metadata, buffer_)) {
    return false;
  }
  // Decode attribute metadata.
  for (uint32_t i = 0; i < num_att_metadata; ++i) {
    uint32_t att_unique_id;
    if (!DecodeVarint(&att_unique_id, buffer_)) {
      return false;
    }
    std::unique_ptr<AttributeMetadata> att_metadata =
        std::unique_ptr<AttributeMetadata>(new AttributeMetadata());
    att_metadata->set_att_unique_id(att_unique_id);
    if (!DecodeMetadata(static_cast<Metadata *>(att_metadata.get()))) {
      return false;
    }
    metadata->AddAttributeMetadata(std::move(att_metadata));
  }
  return DecodeMetadata(static_cast<Metadata *>(metadata));
}